

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O3

double __thiscall sector_t::HighestCeilingAt(sector_t *this,DVector2 *p,sector_t **resultsec)

{
  double dVar1;
  subsector_t *psVar2;
  double x;
  double y;
  double dVar3;
  
  x = p->X;
  y = p->Y;
  if ((this->planes[1].Flags & 0x1d0U) == 0x100) {
    dVar3 = -3.4028234663852886e+38;
    do {
      dVar1 = sectorPortals.Array[this->Portals[1]].mPlaneZ;
      if (dVar1 <= dVar3) break;
      x = x + sectorPortals.Array[this->Portals[1]].mDisplacement.X;
      y = y + sectorPortals.Array[this->Portals[1]].mDisplacement.Y;
      psVar2 = P_PointInSubsector(x,y);
      this = psVar2->sector;
      dVar3 = dVar1;
    } while ((this->planes[1].Flags & 0x1d0U) == 0x100);
  }
  if (resultsec != (sector_t **)0x0) {
    *resultsec = this;
  }
  return (y * (this->ceilingplane).normal.Y +
         (this->ceilingplane).D + x * (this->ceilingplane).normal.X) * (this->ceilingplane).negiC;
}

Assistant:

double sector_t::HighestCeilingAt(const DVector2 &p, sector_t **resultsec)
{
	sector_t *check = this;
	double planeheight = -FLT_MAX;
	DVector2 pos = p;

	// Continue until we find a blocking portal or a portal below where we actually are.
	while (!check->PortalBlocksMovement(ceiling) && planeheight < check->GetPortalPlaneZ(ceiling))
	{
		pos += check->GetPortalDisplacement(ceiling);
		planeheight = check->GetPortalPlaneZ(ceiling);
		check = P_PointInSector(pos);
	}
	if (resultsec) *resultsec = check;
	return check->ceilingplane.ZatPoint(pos);
}